

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  cJSON *pcVar7;
  uint uVar8;
  
  if (name != (char *)0x0 && object != (cJSON *)0x0) {
    pcVar7 = object->child;
    if (case_sensitive == 0) {
      for (; pcVar7 != (cJSON *)0x0; pcVar7 = pcVar7->next) {
        pcVar3 = pcVar7->string;
        if (pcVar3 != (char *)0x0) {
          if (pcVar3 == name) {
            return pcVar7;
          }
          lVar6 = 0;
          while( true ) {
            bVar1 = name[lVar6];
            uVar4 = bVar1 + 0x20;
            if (0x19 < bVar1 - 0x41) {
              uVar4 = (uint)bVar1;
            }
            bVar2 = pcVar3[lVar6];
            uVar8 = bVar2 + 0x20;
            if (0x19 < bVar2 - 0x41) {
              uVar8 = (uint)bVar2;
            }
            if (uVar4 != uVar8) break;
            if (bVar1 == 0) {
              return pcVar7;
            }
            lVar6 = lVar6 + 1;
          }
        }
      }
    }
    else {
      for (; pcVar7 != (cJSON *)0x0; pcVar7 = pcVar7->next) {
        iVar5 = strcmp(name,pcVar7->string);
        if (iVar5 == 0) {
          return pcVar7;
        }
      }
    }
  }
  return (cJSON *)0x0;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
	while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    return current_element;
}